

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-custom.cc
# Opt level: O1

MaskImage * __thiscall
DataSourceCustom::get_sprite_parts
          (MaskImage *__return_storage_ptr__,DataSourceCustom *this,Resource res,size_t index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  ConfigFile *pCVar3;
  pointer pcVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  ResInfo *pRVar8;
  long *plVar9;
  ulong *puVar10;
  _Alloc_hider this_00;
  MaskImage *pMVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  _Alloc_hider this_03;
  string image_file_name;
  string mask_file_name;
  string section;
  stringstream stream;
  undefined1 auStack_288 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_280;
  string local_278;
  string local_258;
  string local_238;
  int local_214;
  int local_210;
  int local_20c;
  string local_208;
  int local_1e4;
  MaskImage *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 auStack_198 [12];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  pRVar8 = get_info(this,res);
  if (pRVar8 == (ResInfo *)0x0) {
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>).
    super__Head_base<0UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>).
    super__Head_base<0UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>).
    super__Tuple_impl<1UL,_std::shared_ptr<Data::Sprite>_>.
    super__Head_base<1UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>).
    super__Tuple_impl<1UL,_std::shared_ptr<Data::Sprite>_>.
    super__Head_base<1UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    return __return_storage_ptr__;
  }
  local_1e0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  lVar2 = *(long *)(local_1a8[0] + -0x18);
  if (acStack_c8[lVar2 + 1] == '\0') {
    cVar5 = std::ios::widen((char)auStack_288 + (char)lVar2 + -0x20);
    acStack_c8[lVar2] = cVar5;
    acStack_c8[lVar2 + 1] = '\x01';
  }
  acStack_c8[lVar2] = '0';
  *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 3;
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  pCVar3 = (pRVar8->meta).super___shared_ptr<ConfigFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar1 = &local_278.field_2;
  local_278._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"delta_x","");
  local_208._M_dataplus._M_p = (pointer)((ulong)local_208._M_dataplus._M_p._4_4_ << 0x20);
  iVar7 = ConfigFile::value<int>(pCVar3,&local_1d8,&local_278,(int *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  pCVar3 = (pRVar8->meta).super___shared_ptr<ConfigFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_278._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"delta_y","");
  local_208._M_dataplus._M_p = local_208._M_dataplus._M_p & 0xffffffff00000000;
  local_20c = ConfigFile::value<int>(pCVar3,&local_1d8,&local_278,(int *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  pCVar3 = (pRVar8->meta).super___shared_ptr<ConfigFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_278._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"offset_x","");
  local_208._M_dataplus._M_p = local_208._M_dataplus._M_p & 0xffffffff00000000;
  local_210 = ConfigFile::value<int>(pCVar3,&local_1d8,&local_278,(int *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  pCVar3 = (pRVar8->meta).super___shared_ptr<ConfigFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_278._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"offset_y","");
  local_208._M_dataplus._M_p = local_208._M_dataplus._M_p & 0xffffffff00000000;
  local_214 = ConfigFile::value<int>(pCVar3,&local_1d8,&local_278,(int *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  pCVar3 = (pRVar8->meta).super___shared_ptr<ConfigFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"image_path","");
  paVar1 = &local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_allocated_capacity =
       local_258.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_258._M_dataplus._M_p = (pointer)paVar1;
  ConfigFile::value(&local_278,pCVar3,&local_1d8,&local_208,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar1) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  pCVar3 = (pRVar8->meta).super___shared_ptr<ConfigFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_258._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"mask_path","");
  local_238._M_string_length = 0;
  local_238.field_2._M_local_buf[0] = '\0';
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  ConfigFile::value(&local_208,pCVar3,&local_1d8,&local_258,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,
                    CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                             local_238.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar1) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_278._M_string_length != 0) {
    local_258._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<SpriteFile,std::allocator<SpriteFile>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_258._M_string_length,
               (SpriteFile **)&local_258,(allocator<SpriteFile> *)&local_238);
    std::__shared_ptr<SpriteFile,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<SpriteFile,SpriteFile>
              ((__shared_ptr<SpriteFile,(__gnu_cxx::_Lock_policy)2> *)&local_258,
               (SpriteFile *)local_258._M_dataplus._M_p);
    local_280 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._M_string_length;
    this_03._M_p = local_258._M_dataplus._M_p;
    local_258._M_string_length = 0;
    local_258._M_dataplus._M_p = (pointer)0x0;
    pcVar4 = (pRVar8->path)._M_dataplus._M_p;
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,pcVar4,pcVar4 + (pRVar8->path)._M_string_length);
    std::__cxx11::string::append((char *)&local_238);
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_238,(ulong)local_278._M_dataplus._M_p);
    puVar10 = (ulong *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_258.field_2._M_allocated_capacity = *puVar10;
      local_258.field_2._8_8_ = plVar9[3];
      local_258._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_258.field_2._M_allocated_capacity = *puVar10;
      local_258._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_258._M_string_length = plVar9[1];
    *plVar9 = (long)puVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    bVar6 = SpriteFile::load((SpriteFile *)this_03._M_p,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,
                      CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                               local_238.field_2._M_local_buf[0]) + 1);
    }
    if (bVar6) {
      *(int *)&((element_type *)(this_03._M_p + 0x18))->_vptr_Sprite = iVar7;
      *(int *)(this_03._M_p + 0x1c) = local_20c;
      *(int *)&((enable_shared_from_this<Data::Sprite> *)(this_03._M_p + 0x20))->_M_weak_this =
           local_210;
      *(int *)(this_03._M_p + 0x24) = local_214;
      goto LAB_00137063;
    }
    if (local_280 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_280);
    }
  }
  this_03._M_p = (pointer)0x0;
  local_280 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00137063:
  if (local_208._M_string_length == 0) {
    this_00._M_p = (pointer)0x0;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pMVar11 = local_1e0;
    this_02 = local_280;
  }
  else {
    local_258._M_dataplus._M_p = (pointer)0x0;
    local_1e4 = iVar7;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<SpriteFile,std::allocator<SpriteFile>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_258._M_string_length,
               (SpriteFile **)&local_258,(allocator<SpriteFile> *)&local_238);
    std::__shared_ptr<SpriteFile,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<SpriteFile,SpriteFile>
              ((__shared_ptr<SpriteFile,(__gnu_cxx::_Lock_policy)2> *)&local_258,
               (SpriteFile *)local_258._M_dataplus._M_p);
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._M_string_length;
    this_00._M_p = local_258._M_dataplus._M_p;
    local_258._M_string_length = 0;
    local_258._M_dataplus._M_p = (pointer)0x0;
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    pcVar4 = (pRVar8->path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,pcVar4,pcVar4 + (pRVar8->path)._M_string_length);
    std::__cxx11::string::append((char *)&local_238);
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_238,(ulong)local_208._M_dataplus._M_p);
    puVar10 = (ulong *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_258.field_2._M_allocated_capacity = *puVar10;
      local_258.field_2._8_8_ = plVar9[3];
      local_258._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_258.field_2._M_allocated_capacity = *puVar10;
      local_258._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_258._M_string_length = plVar9[1];
    *plVar9 = (long)puVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    bVar6 = SpriteFile::load((SpriteFile *)this_00._M_p,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    pMVar11 = local_1e0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,
                      CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                               local_238.field_2._M_local_buf[0]) + 1);
    }
    this_02 = local_280;
    if (bVar6) {
      *(int *)&((element_type *)(this_00._M_p + 0x18))->_vptr_Sprite = local_1e4;
      *(int *)(this_00._M_p + 0x1c) = local_20c;
      *(int *)&(((enable_shared_from_this<Data::Sprite> *)(this_00._M_p + 0x20))->_M_weak_this).
               super___weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_210;
      *(int *)(this_00._M_p + 0x24) = local_214;
    }
    else {
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      this_00._M_p = (pointer)0x0;
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
  }
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_02->_M_use_count = this_02->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_02->_M_use_count = this_02->_M_use_count + 1;
    }
  }
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (pMVar11->super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>)
    .super__Tuple_impl<1UL,_std::shared_ptr<Data::Sprite>_>.
    super__Head_base<1UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this_03._M_p;
    (pMVar11->super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>)
    .super__Tuple_impl<1UL,_std::shared_ptr<Data::Sprite>_>.
    super__Head_base<1UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_02;
    (pMVar11->super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>)
    .super__Head_base<0UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this_00._M_p;
    (pMVar11->super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>)
    .super__Head_base<0UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
    (pMVar11->super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>)
    .super__Tuple_impl<1UL,_std::shared_ptr<Data::Sprite>_>.
    super__Head_base<1UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this_03._M_p;
    (pMVar11->super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>)
    .super__Tuple_impl<1UL,_std::shared_ptr<Data::Sprite>_>.
    super__Head_base<1UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_02;
    (pMVar11->super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>)
    .super__Head_base<0UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this_00._M_p;
    (pMVar11->super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>)
    .super__Head_base<0UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_01;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
  }
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pMVar11;
}

Assistant:

Data::MaskImage
DataSourceCustom::get_sprite_parts(Data::Resource res, size_t index) {
  ResInfo *info = get_info(res);
  if (info == nullptr) {
    return std::make_tuple(nullptr, nullptr);
  }

  std::stringstream stream;
  stream << std::setfill('0') << std::setw(3) << index;
  std::string section = stream.str();

  int delta_x = info->meta->value(section, "delta_x", 0);
  int delta_y = info->meta->value(section, "delta_y", 0);
  int offset_x = info->meta->value(section, "offset_x", 0);
  int offset_y = info->meta->value(section, "offset_y", 0);
  std::string image_file_name = info->meta->value(section,
                                                  "image_path",
                                                  std::string());
  std::string mask_file_name = info->meta->value(section,
                                                 "mask_path",
                                                 std::string());

  PSpriteFile image;
  if (!image_file_name.empty()) {
    image = std::make_shared<SpriteFile>();
    if (image->load(info->path + "/" + image_file_name)) {
      image->set_delta(delta_x, delta_y);
      image->set_offset(offset_x, offset_y);
    } else {
      image = nullptr;
    }
  }

  PSpriteFile mask;
  if (!mask_file_name.empty()) {
    mask = std::make_shared<SpriteFile>();
    if (mask->load(info->path + "/" + mask_file_name)) {
      mask->set_delta(delta_x, delta_y);
      mask->set_offset(offset_x, offset_y);
    } else {
      mask = nullptr;
    }
  }

  return std::make_tuple(mask, image);
}